

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

void __thiscall
DnsStats::SubmitCborRecords
          (DnsStats *this,cdns *cdns_ctx,cdns_query *query,cdns_query_signature *q_sig,
          cdns_qr_extended *ext,bool is_response)

{
  int iVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  cdns_query_signature *pcVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  int *piVar9;
  long lVar10;
  uint uVar11;
  int rrclass;
  int rrtype;
  ulong uVar12;
  long lVar13;
  undefined7 in_register_00000089;
  long lVar14;
  uint32_t e_length;
  uint32_t e_rcode;
  cdns_query_signature *local_a0;
  cdns_query *local_98;
  uint local_8c;
  int local_88;
  uint local_84;
  cdns *local_80;
  ulong local_78;
  uint32_t *local_70;
  uint32_t *local_68;
  long local_60;
  pointer local_58;
  ulong local_50;
  int iStack_48;
  undefined8 local_44;
  int local_3c;
  
  piVar9 = &q_sig->query_rcode;
  if ((int)CONCAT71(in_register_00000089,is_response) != 0) {
    piVar9 = &q_sig->response_rcode;
  }
  local_8c = *piVar9;
  e_rcode = 0;
  e_length = 0x200;
  local_a0 = q_sig;
  local_98 = query;
  if (ext->is_filled == true) {
    local_44._0_4_ = ext->answer_index;
    local_44._4_4_ = ext->authority_index;
    local_3c = ext->additional_index;
    if (-1 < ext->question_index) {
      lVar10 = (long)q_sig->query_classtype_index - (long)cdns_ctx->index_offset;
      lVar13 = (long)query->query_name_index - (long)cdns_ctx->index_offset;
      pcVar2 = (cdns_ctx->block).tables.class_ids.
               super__Vector_base<cdns_class_id,_std::allocator<cdns_class_id>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar3 = (cdns_ctx->block).tables.name_rdata.
               super__Vector_base<cbor_bytes,_std::allocator<cbor_bytes>_>._M_impl.
               super__Vector_impl_data._M_start;
      SubmitQueryContent(this,pcVar2[lVar10].rr_type,pcVar2[lVar10].rr_class,pcVar3[lVar13].v,
                         (uint32_t)pcVar3[lVar13].l,0);
    }
    uVar11 = 0xffffffff;
    local_78 = (ulong)is_response;
    local_80 = cdns_ctx;
    for (lVar10 = 1; lVar10 != 4; lVar10 = lVar10 + 1) {
      if (-1 < (long)(&iStack_48)[lVar10]) {
        local_58 = (cdns_ctx->block).tables.rr_list.
                   super__Vector_base<cdns_rr_list,_std::allocator<cdns_rr_list>_>._M_impl.
                   super__Vector_impl_data._M_start +
                   ((long)(&iStack_48)[lVar10] - (long)cdns_ctx->index_offset);
        local_68 = (uint32_t *)0x0;
        if (lVar10 == 3) {
          local_68 = &e_rcode;
        }
        local_70 = (uint32_t *)0x0;
        if (lVar10 == 3) {
          local_70 = &e_length;
        }
        uVar12 = 0;
        local_60 = lVar10;
        while (lVar13 = *(long *)&(local_58->rr_index).super__Vector_base<int,_std::allocator<int>_>
                                  ._M_impl, lVar10 = local_60,
              uVar12 < (ulong)((long)*(pointer *)
                                      ((long)&(local_58->rr_index).
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      + 8) - lVar13 >> 2)) {
          lVar10 = (long)cdns_ctx->index_offset;
          lVar13 = *(int *)(lVar13 + uVar12 * 4) - lVar10;
          pcVar2 = (cdns_ctx->block).tables.class_ids.
                   super__Vector_base<cdns_class_id,_std::allocator<cdns_class_id>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pcVar4 = (cdns_ctx->block).tables.rrs.
                   super__Vector_base<cdns_rr_field,_std::allocator<cdns_rr_field>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar14 = pcVar4[lVar13].classtype_index - lVar10;
          iVar8 = pcVar4[lVar13].rdata_index;
          iVar1 = pcVar4[lVar13].name_index;
          rrtype = pcVar2[lVar14].rr_type;
          local_84 = uVar11;
          local_50 = uVar12;
          if (rrtype == 0x29) {
            local_88 = local_a0->udp_buf_size;
            uVar7 = cdns::get_edns_flags(local_a0->qr_dns_flags);
            uVar11 = uVar7 | 0x8000;
            if (this->dnssec_packet == (uint8_t *)0x0) {
              uVar11 = uVar7;
            }
            rrtype = (local_80->block).tables.class_ids.
                     super__Vector_base<cdns_class_id,_std::allocator<cdns_class_id>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar14].rr_type;
            cdns_ctx = local_80;
            rrclass = local_88;
          }
          else {
            rrclass = pcVar2[lVar14].rr_class;
            uVar11 = pcVar4[lVar13].ttl;
          }
          lVar14 = iVar8 - lVar10;
          lVar10 = iVar1 - lVar10;
          pcVar3 = (cdns_ctx->block).tables.name_rdata.
                   super__Vector_base<cbor_bytes,_std::allocator<cbor_bytes>_>._M_impl.
                   super__Vector_impl_data._M_start;
          SubmitRecordContent(this,rrtype,rrclass,uVar11,(int)pcVar3[lVar14].l,pcVar3[lVar14].v,
                              pcVar3[lVar10].v,(uint32_t)pcVar3[lVar10].l,0,local_68,local_70,
                              SUB81(local_78,0));
          uVar7 = local_84;
          if ((int)local_84 < 0) {
            uVar7 = pcVar4[lVar13].name_index;
          }
          uVar11 = local_84;
          if (local_60 != 3) {
            uVar11 = uVar7;
          }
          uVar12 = local_50 + 1;
        }
      }
    }
  }
  else {
    uVar11 = 0xffffffff;
  }
  pcVar5 = local_a0;
  if (!is_response) {
    iVar8 = cdns::get_edns_flags(local_a0->qr_dns_flags);
    if (-1 < (long)pcVar5->opt_rdata_index) {
      lVar10 = (long)pcVar5->opt_rdata_index - (long)cdns_ctx->index_offset;
      pcVar3 = (cdns_ctx->block).tables.name_rdata.
               super__Vector_base<cbor_bytes,_std::allocator<cbor_bytes>_>._M_impl.
               super__Vector_impl_data._M_start;
      SubmitRecordContent(this,0x29,local_a0->udp_buf_size,iVar8,(int)pcVar3[lVar10].l,
                          pcVar3[lVar10].v,(uint8_t *)0x0,0,0,&e_rcode,&e_length,false);
    }
  }
  SubmitRegistryNumber(this,4,e_rcode << 4 | local_8c);
  if ((this->dnsstat_flags & 0x10) == 0) {
    if (!is_response) {
      return;
    }
  }
  else {
    if (!is_response) {
      SubmitRegistryNumber(this,0x13,local_98->query_size);
      SubmitRegistryNumber(this,0x12,e_length);
      return;
    }
    SubmitRegistryNumber(this,0x14,local_98->response_size);
    uVar7 = cdns::get_dns_flags(local_a0->qr_dns_flags,true);
    if ((uVar7 & 0x20) != 0) {
      SubmitRegistryNumber(this,0x15,e_length);
    }
  }
  if (-1 < (int)uVar11) {
    lVar13 = (long)cdns_ctx->index_offset;
    lVar10 = local_98->query_name_index - lVar13;
    pcVar3 = (cdns_ctx->block).tables.name_rdata.
             super__Vector_base<cbor_bytes,_std::allocator<cbor_bytes>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pcVar3[lVar10].l != 0) {
      lVar14 = local_a0->query_classtype_index - lVar13;
      pcVar2 = (cdns_ctx->block).tables.class_ids.
               super__Vector_base<cdns_class_id,_std::allocator<cdns_class_id>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar6 = IsQNameMinimized(1,pcVar2[lVar14].rr_class,pcVar2[lVar14].rr_type,pcVar3[lVar10].v,
                               (uint32_t)pcVar3[lVar10].l,0,pcVar3[(ulong)uVar11 - lVar13].v,
                               (uint32_t)pcVar3[(ulong)uVar11 - lVar13].l,0);
      this->is_qname_minimized = bVar6;
      return;
    }
  }
  this->is_qname_minimized = true;
  return;
}

Assistant:

void DnsStats::SubmitCborRecords(cdns* cdns_ctx, cdns_query* query, cdns_query_signature* q_sig,
    cdns_qr_extended * ext, bool is_response)
{
    uint32_t rcode = (is_response) ? q_sig->response_rcode : q_sig->query_rcode;
    uint32_t e_rcode = 0;
    uint32_t e_length = 512;
    int first_rname_index = -1;


    if (ext->is_filled) {
        int x_i[4] = { ext->question_index, ext->answer_index, ext->authority_index, ext->additional_index };

        if (x_i[0] >= 0) {
            /* assume just one query per q_sig, but sometimes there is none. */
            size_t cid = (size_t)q_sig->query_classtype_index - cdns_ctx->index_offset;
            size_t nid = (size_t)query->query_name_index - cdns_ctx->index_offset;
            SubmitQueryContent(cdns_ctx->block.tables.class_ids[cid].rr_type,
                cdns_ctx->block.tables.class_ids[cid].rr_class,
                cdns_ctx->block.tables.name_rdata[nid].v,
                (uint32_t)cdns_ctx->block.tables.name_rdata[nid].l, 0);
        }

        for (int i = 1; i < 4; i++) {
            if (x_i[i] >= 0) {
                cdns_rr_list* list = &cdns_ctx->block.tables.rr_list[(size_t)x_i[i]- cdns_ctx->index_offset];

                for (size_t j = 0; j < list->rr_index.size(); j++) {
                    cdns_rr_field * rr = &cdns_ctx->block.tables.rrs[(size_t)list->rr_index[j]- cdns_ctx->index_offset];
                    size_t cid = (size_t)rr->classtype_index - cdns_ctx->index_offset;
                    size_t rrid = (size_t) rr->rdata_index - cdns_ctx->index_offset;
                    size_t nid = (size_t)rr->name_index - cdns_ctx->index_offset;
                    int rr_class = cdns_ctx->block.tables.class_ids[cid].rr_class;
                    int ttl = rr->ttl;

                    if (cdns_ctx->block.tables.class_ids[cid].rr_type == DnsRtype_OPT) {
                        rr_class = q_sig->udp_buf_size;
                        ttl = cdns::get_edns_flags(q_sig->qr_dns_flags);

                        if (dnssec_packet != NULL) {
                            ttl |= (1 << 15);
                        }
                    }

                    SubmitRecordContent(
                        cdns_ctx->block.tables.class_ids[cid].rr_type, rr_class, ttl,
                        (uint32_t)cdns_ctx->block.tables.name_rdata[rrid].l,
                        cdns_ctx->block.tables.name_rdata[rrid].v,
                        cdns_ctx->block.tables.name_rdata[nid].v,
                        (uint32_t)cdns_ctx->block.tables.name_rdata[nid].l,
                        0, (i == 3) ? &e_rcode : NULL, (i == 3) ? &e_length : NULL, is_response);
                    if (first_rname_index < 0 && i < 3) {
                        first_rname_index = rr->name_index;
                    }
                }
            }
        }
    }

    if (!is_response) {
        int edns_flags = cdns::get_edns_flags(q_sig->qr_dns_flags);
        if (q_sig->opt_rdata_index >= 0) {
            size_t opt_rrid = (size_t)q_sig->opt_rdata_index - cdns_ctx->index_offset;

            SubmitRecordContent(DnsRtype_OPT, q_sig->udp_buf_size, edns_flags,
                (uint32_t)cdns_ctx->block.tables.name_rdata[opt_rrid].l,
                cdns_ctx->block.tables.name_rdata[opt_rrid].v,
                NULL, 0, 0, &e_rcode, &e_length, is_response);
        }
    }

    
    rcode |= (e_rcode << 4);
    SubmitRegistryNumber(REGISTRY_DNS_RCODES, rcode);

    if ((dnsstat_flags & dnsStateFlagCountPacketSizes) != 0)
    {
        if (is_response)
        {
            SubmitRegistryNumber(REGISTRY_DNS_Response_Size, query->response_size);
            if ((cdns::get_dns_flags(q_sig->qr_dns_flags,true) & (1 << 5)) != 0)
            {
                SubmitRegistryNumber(REGISTRY_DNS_TC_length, e_length);
            }
        }
        else
        {
            SubmitRegistryNumber(REGISTRY_DNS_Query_Size, query->query_size);
            SubmitRegistryNumber(REGISTRY_EDNS_Packet_Size, e_length);
        }
    }

    if (is_response) {
        size_t nid = (size_t)query->query_name_index - cdns_ctx->index_offset;
        if (first_rname_index >= 0) {
            if (cdns_ctx->block.tables.name_rdata[nid].l == 0) {
                is_qname_minimized = true;
            }
            else {
                size_t cid = (size_t)q_sig->query_classtype_index - cdns_ctx->index_offset;
                size_t rname_id = (size_t)first_rname_index - cdns_ctx->index_offset;

                is_qname_minimized = IsQNameMinimized(
                    1,
                    cdns_ctx->block.tables.class_ids[cid].rr_class,
                    cdns_ctx->block.tables.class_ids[cid].rr_type,
                    cdns_ctx->block.tables.name_rdata[nid].v,
                    (uint32_t)cdns_ctx->block.tables.name_rdata[nid].l, 0,
                    cdns_ctx->block.tables.name_rdata[rname_id].v,
                    (uint32_t)cdns_ctx->block.tables.name_rdata[rname_id].l, 0);
            }
        }
        else {
            /* In the absence of further knowledge, assume that this is true. */
            is_qname_minimized = true;
        }
    }
}